

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void NavUpdateWindowingHighlightWindow(int focus_change_dir)

{
  ImVec2 IVar1;
  ImGuiContext *pIVar2;
  int dir;
  int in_EDI;
  ImGuiWindow *window_target;
  int i_current;
  ImGuiContext *g;
  int in_stack_ffffffffffffffd4;
  float in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffdc;
  ImGuiWindow *local_20;
  
  pIVar2 = GImGui;
  if ((GImGui->NavWindowingTarget->Flags & 0x8000000U) == 0) {
    ImGui::FindWindowFocusIndex(GImGui->NavWindowingTarget);
    local_20 = FindWindowNavFocusable
                         ((int)in_stack_ffffffffffffffdc,(int)in_stack_ffffffffffffffd8,
                          in_stack_ffffffffffffffd4);
    if (local_20 == (ImGuiWindow *)0x0) {
      if (in_EDI < 0) {
        dir = (pIVar2->WindowsFocusOrder).Size + -1;
      }
      else {
        dir = 0;
      }
      local_20 = FindWindowNavFocusable
                           ((int)in_stack_ffffffffffffffdc,(int)in_stack_ffffffffffffffd8,dir);
    }
    if (local_20 != (ImGuiWindow *)0x0) {
      pIVar2->NavWindowingTargetAnim = local_20;
      pIVar2->NavWindowingTarget = local_20;
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd8,0.0,0.0);
      IVar1.y = in_stack_ffffffffffffffdc;
      IVar1.x = in_stack_ffffffffffffffd8;
      pIVar2->NavWindowingAccumDeltaSize = IVar1;
      pIVar2->NavWindowingAccumDeltaPos = pIVar2->NavWindowingAccumDeltaSize;
    }
    pIVar2->NavWindowingToggleLayer = false;
  }
  return;
}

Assistant:

static void NavUpdateWindowingHighlightWindow(int focus_change_dir)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.NavWindowingTarget);
    if (g.NavWindowingTarget->Flags & ImGuiWindowFlags_Modal)
        return;

    const int i_current = ImGui::FindWindowFocusIndex(g.NavWindowingTarget);
    ImGuiWindow* window_target = FindWindowNavFocusable(i_current + focus_change_dir, -INT_MAX, focus_change_dir);
    if (!window_target)
        window_target = FindWindowNavFocusable((focus_change_dir < 0) ? (g.WindowsFocusOrder.Size - 1) : 0, i_current, focus_change_dir);
    if (window_target) // Don't reset windowing target if there's a single window in the list
    {
        g.NavWindowingTarget = g.NavWindowingTargetAnim = window_target;
        g.NavWindowingAccumDeltaPos = g.NavWindowingAccumDeltaSize = ImVec2(0.0f, 0.0f);
    }
    g.NavWindowingToggleLayer = false;
}